

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmClr<(moira::Instr)36,(moira::Mode)6,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  undefined2 in_CX;
  StrWriter *in_RSI;
  StrWriter *in_RDI;
  Ea<(moira::Mode)6,_(moira::Size)1> dst;
  Ea<(moira::Mode)6,_(moira::Size)1> *in_stack_ffffffffffffffb8;
  u32 *in_stack_ffffffffffffffd0;
  u16 in_stack_ffffffffffffffde;
  undefined6 in_stack_ffffffffffffffe0;
  
  Op<(moira::Mode)6,(moira::Size)1>
            ((Moira *)CONCAT26(in_CX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffde,
             in_stack_ffffffffffffffd0);
  pSVar1 = StrWriter::operator<<(in_RSI);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Align)*(int *)(in_RDI->comment + 0x14));
  StrWriter::operator<<(in_RDI,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void
Moira::dasmClr(StrWriter &str, u32 &addr, u16 op)
{
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << dst;
}